

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O1

wchar_t strncat_from_utf8_to_utf8(archive_string *as,void *_p,size_t len,archive_string_conv *sc)

{
  bool bVar1;
  wchar_t wVar2;
  archive_string *paVar3;
  archive_string *paVar4;
  size_t sVar5;
  size_t __n;
  wchar_t wVar6;
  char *p;
  uint32_t uc;
  wchar_t local_58;
  uint local_54;
  char *local_50;
  char *local_48;
  archive_string *local_40;
  size_t local_38;
  
  paVar3 = archive_string_ensure(as,len + as->length + 1);
  if (paVar3 == (archive_string *)0x0) {
LAB_00146ae6:
    local_58 = L'\xffffffff';
  }
  else {
    p = as->s + as->length;
    local_50 = as->s + (as->buffer_length - 1);
    local_58 = L'\0';
    local_48 = (char *)_p;
    local_40 = as;
    do {
      while( true ) {
        wVar2 = _utf8_to_unicode(&local_54,(char *)_p,len);
        paVar3 = local_40;
        if ((wVar2 != L'\x03') || (wVar6 = L'\xfffffffd', (local_54 & 0xfffff800) != 0xd800)) {
          wVar6 = wVar2;
        }
        if (wVar6 < L'\x01') break;
        _p = (void *)((long)_p + (ulong)(uint)wVar6);
        len = len - (uint)wVar6;
      }
      if (local_48 < _p) {
        __n = (long)_p - (long)local_48;
        if (p + __n <= local_50) {
LAB_001469c2:
          memcpy(p,local_48,__n);
          p = p + __n;
          goto LAB_001469db;
        }
        local_40->length = (long)p - (long)local_40->s;
        local_38 = __n;
        paVar4 = archive_string_ensure(local_40,len + local_40->buffer_length + 1);
        if (paVar4 != (archive_string *)0x0) {
          p = paVar3->s + paVar3->length;
          local_50 = paVar3->s + (paVar3->buffer_length - 1);
          __n = local_38;
          goto LAB_001469c2;
        }
LAB_00146aca:
        bVar1 = false;
      }
      else {
LAB_001469db:
        bVar1 = true;
        if (wVar6 < L'\0') {
          wVar2 = wVar6;
          if ((wVar6 == L'\xfffffffd') && ((local_54 & 0xfffff800) == 0xd800)) {
            wVar2 = cesu8_to_unicode(&local_54,(char *)_p,len);
          }
          wVar6 = -wVar2;
          if (L'\0' < wVar2) {
            wVar6 = wVar2;
          }
          if (wVar2 < L'\0') {
            local_58 = L'\xffffffff';
          }
          sVar5 = unicode_to_utf8(p,(long)local_50 - (long)p,local_54);
          paVar3 = local_40;
          if (sVar5 == 0) {
            local_38 = len + 1;
            local_48 = (char *)CONCAT44(local_48._4_4_,local_54);
            local_40->length = (long)p - (long)local_40->s;
            sVar5 = local_40->buffer_length + local_38;
            while (paVar4 = archive_string_ensure(paVar3,sVar5), paVar4 != (archive_string *)0x0) {
              p = paVar3->s + paVar3->length;
              local_50 = paVar3->s + (paVar3->buffer_length - 1);
              sVar5 = unicode_to_utf8(p,(long)local_50 - (long)p,(uint32_t)local_48);
              if (sVar5 != 0) goto LAB_00146a40;
              paVar3->length = (long)p - (long)paVar3->s;
              sVar5 = paVar3->buffer_length + local_38;
            }
            goto LAB_00146aca;
          }
LAB_00146a40:
          p = p + sVar5;
          _p = (void *)((long)_p + (ulong)(uint)wVar6);
          len = len - (uint)wVar6;
          bVar1 = true;
        }
        else {
          wVar6 = L'\0';
        }
      }
      if (!bVar1) goto LAB_00146ae6;
      local_48 = (char *)_p;
    } while (L'\0' < wVar6);
    local_40->length = (long)p - (long)local_40->s;
    *p = '\0';
  }
  return local_58;
}

Assistant:

static int
strncat_from_utf8_to_utf8(struct archive_string *as, const void *_p,
    size_t len, struct archive_string_conv *sc)
{
	const char *s;
	char *p, *endp;
	int n, ret = 0;

	(void)sc; /* UNUSED */

	if (archive_string_ensure(as, as->length + len + 1) == NULL)
		return (-1);

	s = (const char *)_p;
	p = as->s + as->length;
	endp = as->s + as->buffer_length -1;
	do {
		uint32_t uc;
		const char *ss = s;
		size_t w;

		/*
		 * Forward byte sequence until a conversion of that is needed.
		 */
		while ((n = utf8_to_unicode(&uc, s, len)) > 0) {
			s += n;
			len -= n;
		}
		if (ss < s) {
			if (p + (s - ss) > endp) {
				as->length = p - as->s;
				if (archive_string_ensure(as,
				    as->buffer_length + len + 1) == NULL)
					return (-1);
				p = as->s + as->length;
				endp = as->s + as->buffer_length -1;
			}

			memcpy(p, ss, s - ss);
			p += s - ss;
		}

		/*
		 * If n is negative, current byte sequence needs a replacement.
		 */
		if (n < 0) {
			if (n == -3 && IS_SURROGATE_PAIR_LA(uc)) {
				/* Current byte sequence may be CESU-8. */
				n = cesu8_to_unicode(&uc, s, len);
			}
			if (n < 0) {
				ret = -1;
				n *= -1;/* Use a replaced unicode character. */
			}

			/* Rebuild UTF-8 byte sequence. */
			while ((w = unicode_to_utf8(p, endp - p, uc)) == 0) {
				as->length = p - as->s;
				if (archive_string_ensure(as,
				    as->buffer_length + len + 1) == NULL)
					return (-1);
				p = as->s + as->length;
				endp = as->s + as->buffer_length -1;
			}
			p += w;
			s += n;
			len -= n;
		}
	} while (n > 0);
	as->length = p - as->s;
	as->s[as->length] = '\0';
	return (ret);
}